

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::createNoArgOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration precision,Id typeId)

{
  SpvBuildLogger *this_00;
  bool bVar1;
  uint executionScope;
  EShLanguage EVar2;
  MemorySemanticsMask MVar3;
  Id IVar4;
  allocator<char> local_101;
  string local_100;
  Id local_dc;
  undefined1 local_d8 [4];
  Id result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args_4;
  Decoration local_b8;
  Op spv_op;
  Decoration precision_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args_3;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> args_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args_1;
  undefined1 local_58 [4];
  Id id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  Scope memoryBarrierScope;
  Id typeId_local;
  Decoration precision_local;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  executionScope = (uint)bVar1 * 4 + 1;
  if (op == EOpEmitVertex) {
    spv::Builder::createNoResultOp(&this->builder,OpEmitVertex);
    this_local._4_4_ = 0;
  }
  else if (op == EOpEndPrimitive) {
    spv::Builder::createNoResultOp(&this->builder,OpEndPrimitive);
    this_local._4_4_ = 0;
  }
  else if (op == EOpBarrier) {
    EVar2 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if (EVar2 == EShLangTessControl) {
      bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
      if (bVar1) {
        MVar3 = spv::operator|(MemorySemanticsOutputMemoryKHRMask,AcquireRelease);
        spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,ScopeWorkgroup,MVar3);
        spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
      }
      else {
        spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,Invocation,MaskNone);
      }
    }
    else {
      MVar3 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,AcquireRelease);
      spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,ScopeWorkgroup,MVar3);
    }
    this_local._4_4_ = 0;
  }
  else if (op == EOpMemoryBarrier) {
    MVar3 = spv::operator|(spv::MemorySemanticsAllMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,executionScope,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpMemoryBarrierAtomicCounter) {
    MVar3 = spv::operator|(AtomicCounterMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,executionScope,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpMemoryBarrierBuffer) {
    MVar3 = spv::operator|(MemorySemanticsUniformMemoryMask,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,executionScope,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpMemoryBarrierImage) {
    MVar3 = spv::operator|(ImageMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,executionScope,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpMemoryBarrierShared) {
    MVar3 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,executionScope,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpGroupMemoryBarrier) {
    MVar3 = spv::operator|(spv::MemorySemanticsAllMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,2,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupBarrier) {
    MVar3 = spv::operator|(spv::MemorySemanticsAllMemory,AcquireRelease);
    spv::Builder::createControlBarrier(&this->builder,ScopeSubgroup,ScopeSubgroup,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupMemoryBarrier) {
    MVar3 = spv::operator|(spv::MemorySemanticsAllMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,3,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupMemoryBarrierBuffer) {
    MVar3 = spv::operator|(MemorySemanticsUniformMemoryMask,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,3,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupMemoryBarrierImage) {
    MVar3 = spv::operator|(ImageMemory,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,3,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupMemoryBarrierShared) {
    MVar3 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,3,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpSubgroupElect) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    this_local._4_4_ =
         createSubgroupOperation
                   (this,EOpSubgroupElect,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,EbtVoid);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else if (op == EOpTime) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    IVar4 = getExtBuiltins(this,"SPV_AMD_gcn_shader");
    IVar4 = spv::Builder::createBuiltinCall
                      (&this->builder,typeId,IVar4,3,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    this_local._4_4_ = spv::Builder::setPrecision(&this->builder,IVar4,precision);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  }
  else if (op == EOpBeginInvocationInterlock) {
    spv::Builder::createNoResultOp(&this->builder,OpBeginInvocationInterlockEXT);
    this_local._4_4_ = 0;
  }
  else if (op == EOpEndInvocationInterlock) {
    spv::Builder::createNoResultOp(&this->builder,OpEndInvocationInterlockEXT);
    this_local._4_4_ = 0;
  }
  else if (op == EOpIsHelperInvocation) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &args_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    spv::Builder::addExtension(&this->builder,"SPV_EXT_demote_to_helper_invocation");
    spv::Builder::addCapability(&this->builder,CapabilityDemoteToHelperInvocation);
    this_local._4_4_ =
         spv::Builder::createOp
                   (&this->builder,OpIsHelperInvocationEXT,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &args_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &args_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else if (op == EOpIgnoreIntersectionNV) {
    spv::Builder::createNoResultOp(&this->builder,OpIgnoreIntersectionNV);
    this_local._4_4_ = 0;
  }
  else if (op == EOpTerminateRayNV) {
    spv::Builder::createNoResultOp(&this->builder,OpTerminateRayNV);
    this_local._4_4_ = 0;
  }
  else if (op == EOpRayQueryInitialize) {
    spv::Builder::createNoResultOp(&this->builder,OpRayQueryInitializeKHR);
    this_local._4_4_ = 0;
  }
  else if (op == EOpRayQueryTerminate) {
    spv::Builder::createNoResultOp(&this->builder,OpRayQueryTerminateKHR);
    this_local._4_4_ = 0;
  }
  else if (op == EOpRayQueryGenerateIntersection) {
    spv::Builder::createNoResultOp(&this->builder,OpRayQueryGenerateIntersectionKHR);
    this_local._4_4_ = 0;
  }
  else if (op == EOpRayQueryConfirmIntersection) {
    spv::Builder::createNoResultOp(&this->builder,OpRayQueryConfirmIntersectionKHR);
    this_local._4_4_ = 0;
  }
  else if (op == EOpAllMemoryBarrierWithGroupSync) {
    MVar3 = spv::operator|(spv::MemorySemanticsAllMemory,AcquireRelease);
    spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,Device,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpDeviceMemoryBarrier) {
    MVar3 = spv::operator|(MemorySemanticsUniformMemoryMask,ImageMemory);
    MVar3 = spv::operator|(MVar3,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,1,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpDeviceMemoryBarrierWithGroupSync) {
    MVar3 = spv::operator|(MemorySemanticsUniformMemoryMask,ImageMemory);
    MVar3 = spv::operator|(MVar3,AcquireRelease);
    spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,Device,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpWorkgroupMemoryBarrier) {
    MVar3 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,AcquireRelease);
    spv::Builder::createMemoryBarrier(&this->builder,2,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpWorkgroupMemoryBarrierWithGroupSync) {
    MVar3 = spv::operator|(MemorySemanticsWorkgroupMemoryMask,AcquireRelease);
    spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,ScopeWorkgroup,MVar3);
    this_local._4_4_ = 0;
  }
  else if (op == EOpReadClockSubgroupKHR) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    args_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::makeUintConstant(&this->builder,3,false);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
               (value_type_conflict *)
               ((long)&args_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_clock");
    spv::Builder::addCapability(&this->builder,CapabilityShaderClockKHR);
    this_local._4_4_ =
         spv::Builder::createOp
                   (&this->builder,OpReadClockKHR,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
  }
  else if (op == EOpReadClockDeviceKHR) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&precision_1);
    spv_op = spv::Builder::makeUintConstant(&this->builder,1,false);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&precision_1,&spv_op);
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_clock");
    spv::Builder::addCapability(&this->builder,CapabilityShaderClockKHR);
    this_local._4_4_ =
         spv::Builder::createOp
                   (&this->builder,OpReadClockKHR,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&precision_1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&precision_1);
  }
  else if (op - EOpStencilAttachmentReadEXT < 2) {
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
    if (op == EOpStencilAttachmentReadEXT) {
      local_b8 = DecorationRelaxedPrecision;
      args_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = OpStencilAttachmentReadEXT;
      spv::Builder::addCapability(&this->builder,CapabilityTileImageStencilReadAccessEXT);
    }
    else {
      local_b8 = DecorationMax;
      args_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = OpDepthAttachmentReadEXT;
      spv::Builder::addCapability(&this->builder,CapabilityTileImageDepthReadAccessEXT);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    local_dc = spv::Builder::createOp
                         (&this->builder,
                          args_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,typeId,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    this_local._4_4_ = spv::Builder::setPrecision(&this->builder,local_dc,local_b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  }
  else {
    this_00 = this->logger;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"unknown operation with no arguments",&local_101);
    spv::SpvBuildLogger::missingFunctionality(this_00,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createNoArgOperation(glslang::TOperator op, spv::Decoration precision, spv::Id typeId)
{
    // GLSL memory barriers use queuefamily scope in new model, device scope in old model
    spv::Scope memoryBarrierScope = glslangIntermediate->usingVulkanMemoryModel() ?
        spv::ScopeQueueFamilyKHR : spv::ScopeDevice;

    switch (op) {
    case glslang::EOpBarrier:
        if (glslangIntermediate->getStage() == EShLangTessControl) {
            if (glslangIntermediate->usingVulkanMemoryModel()) {
                builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                             spv::MemorySemanticsOutputMemoryKHRMask |
                                             spv::MemorySemanticsAcquireReleaseMask);
                builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
            } else {
                builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeInvocation, spv::MemorySemanticsMaskNone);
            }
        } else {
            builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                            spv::MemorySemanticsWorkgroupMemoryMask |
                                            spv::MemorySemanticsAcquireReleaseMask);
        }
        return 0;
    case glslang::EOpMemoryBarrier:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsAllMemory |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierBuffer:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsUniformMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierShared:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsWorkgroupMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpGroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeWorkgroup, spv::MemorySemanticsAllMemory |
                                                         spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierAtomicCounter:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsAtomicCounterMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierImage:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsImageMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpAllMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeDevice,
                                        spv::MemorySemanticsAllMemory |
                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpDeviceMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeDevice, spv::MemorySemanticsUniformMemoryMask |
                                                      spv::MemorySemanticsImageMemoryMask |
                                                      spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpDeviceMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeDevice, spv::MemorySemanticsUniformMemoryMask |
                                                                            spv::MemorySemanticsImageMemoryMask |
                                                                            spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpWorkgroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeWorkgroup, spv::MemorySemanticsWorkgroupMemoryMask |
                                                         spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpWorkgroupMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                        spv::MemorySemanticsWorkgroupMemoryMask |
                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpSubgroupBarrier:
        builder.createControlBarrier(spv::ScopeSubgroup, spv::ScopeSubgroup, spv::MemorySemanticsAllMemory |
                                                                             spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsAllMemory |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierBuffer:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsUniformMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierImage:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsImageMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierShared:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsWorkgroupMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;

    case glslang::EOpEmitVertex:
        builder.createNoResultOp(spv::OpEmitVertex);
        return 0;
    case glslang::EOpEndPrimitive:
        builder.createNoResultOp(spv::OpEndPrimitive);
        return 0;

    case glslang::EOpSubgroupElect: {
        std::vector<spv::Id> operands;
        return createSubgroupOperation(op, typeId, operands, glslang::EbtVoid);
    }
    case glslang::EOpTime:
    {
        std::vector<spv::Id> args; // Dummy arguments
        spv::Id id = builder.createBuiltinCall(typeId, getExtBuiltins(spv::E_SPV_AMD_gcn_shader), spv::TimeAMD, args);
        return builder.setPrecision(id, precision);
    }
    case glslang::EOpIgnoreIntersectionNV:
        builder.createNoResultOp(spv::OpIgnoreIntersectionNV);
        return 0;
    case glslang::EOpTerminateRayNV:
        builder.createNoResultOp(spv::OpTerminateRayNV);
        return 0;
    case glslang::EOpRayQueryInitialize:
        builder.createNoResultOp(spv::OpRayQueryInitializeKHR);
        return 0;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR);
        return 0;
    case glslang::EOpRayQueryGenerateIntersection:
        builder.createNoResultOp(spv::OpRayQueryGenerateIntersectionKHR);
        return 0;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR);
        return 0;
    case glslang::EOpBeginInvocationInterlock:
        builder.createNoResultOp(spv::OpBeginInvocationInterlockEXT);
        return 0;
    case glslang::EOpEndInvocationInterlock:
        builder.createNoResultOp(spv::OpEndInvocationInterlockEXT);
        return 0;

    case glslang::EOpIsHelperInvocation:
    {
        std::vector<spv::Id> args; // Dummy arguments
        builder.addExtension(spv::E_SPV_EXT_demote_to_helper_invocation);
        builder.addCapability(spv::CapabilityDemoteToHelperInvocationEXT);
        return builder.createOp(spv::OpIsHelperInvocationEXT, typeId, args);
    }

    case glslang::EOpReadClockSubgroupKHR: {
        std::vector<spv::Id> args;
        args.push_back(builder.makeUintConstant(spv::ScopeSubgroup));
        builder.addExtension(spv::E_SPV_KHR_shader_clock);
        builder.addCapability(spv::CapabilityShaderClockKHR);
        return builder.createOp(spv::OpReadClockKHR, typeId, args);
    }

    case glslang::EOpReadClockDeviceKHR: {
        std::vector<spv::Id> args;
        args.push_back(builder.makeUintConstant(spv::ScopeDevice));
        builder.addExtension(spv::E_SPV_KHR_shader_clock);
        builder.addCapability(spv::CapabilityShaderClockKHR);
        return builder.createOp(spv::OpReadClockKHR, typeId, args);
    }
    case glslang::EOpStencilAttachmentReadEXT:
    case glslang::EOpDepthAttachmentReadEXT:
    {
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);

        spv::Decoration precision;
        spv::Op spv_op;
        if (op == glslang::EOpStencilAttachmentReadEXT)
        {
            precision = spv::DecorationRelaxedPrecision;
            spv_op = spv::OpStencilAttachmentReadEXT;
            builder.addCapability(spv::CapabilityTileImageStencilReadAccessEXT);
        }
        else
        {
            precision = spv::NoPrecision;
            spv_op = spv::OpDepthAttachmentReadEXT;
            builder.addCapability(spv::CapabilityTileImageDepthReadAccessEXT);
        }

        std::vector<spv::Id> args; // Dummy args
        spv::Id result = builder.createOp(spv_op, typeId, args);
        return builder.setPrecision(result, precision);
    }
    default:
        break;
    }

    logger->missingFunctionality("unknown operation with no arguments");

    return 0;
}